

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O0

void gray_render_cubic(PWorker worker,QT_FT_Vector *control1,QT_FT_Vector *control2,QT_FT_Vector *to
                      )

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  TPos s_limit;
  TPos s;
  TPos L;
  TPos dy2;
  TPos dx2;
  TPos dy1;
  TPos dx1;
  TPos dy_;
  TPos dx_;
  TPos dy;
  TPos dx;
  QT_FT_Vector *arc;
  QT_FT_Vector bez_stack [49];
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  QT_FT_Vector *local_1c0;
  QT_FT_Vector local_198;
  int iVar9;
  TPos in_stack_fffffffffffffe70;
  TPos in_stack_fffffffffffffe78;
  undefined4 uVar10;
  PWorker in_stack_fffffffffffffe80;
  int iVar11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_198,0xaa,0x188);
  local_1c0 = &local_198;
  local_198.x = *in_RCX << 2;
  local_198.y = in_RCX[1] << 2;
  iVar9 = *in_RDX << 2;
  iVar9 = in_RDX[1] << 2;
  iVar9 = *in_RSI << 2;
  iVar9 = in_RSI[1] << 2;
  uVar10 = (int)*(undefined8 *)(in_RDI + 0x68);
  iVar11 = (int)*(undefined8 *)(in_RDI + 0x70);
  iVar9 = (int)(in_stack_fffffffffffffe70 >> 0x28);
  iVar2 = (int)(in_stack_fffffffffffffe78 >> 0x28);
  iVar11 = iVar11 >> 8;
  if ((((((long)(local_198.y >> 8) < *(long *)(in_RDI + 0x28)) ||
        ((long)iVar9 < *(long *)(in_RDI + 0x28))) || ((long)iVar2 < *(long *)(in_RDI + 0x28))) ||
      ((long)iVar11 < *(long *)(in_RDI + 0x28))) &&
     (((*(long *)(in_RDI + 0x20) <= (long)(local_198.y >> 8) ||
       (*(long *)(in_RDI + 0x20) <= (long)iVar9)) ||
      ((*(long *)(in_RDI + 0x20) <= (long)iVar2 || (*(long *)(in_RDI + 0x20) <= (long)iVar11)))))) {
    do {
      while( true ) {
        lVar3 = (long)(local_1c0[3].x - local_1c0->x);
        lVar4 = (long)(local_1c0[3].y - local_1c0->y);
        local_220 = lVar3;
        if (lVar3 < 0) {
          local_220 = -lVar3;
        }
        local_228 = lVar4;
        if (lVar4 < 0) {
          local_228 = -lVar4;
        }
        if (local_228 < local_220) {
          local_230 = local_220 + (local_228 * 3 >> 3);
        }
        else {
          local_230 = local_228 + (local_220 * 3 >> 3);
        }
        if (local_230 < 0x800000) break;
LAB_00513370:
        gray_split_cubic(local_1c0);
        local_1c0 = local_1c0 + 3;
      }
      lVar5 = (long)(local_1c0[1].x - local_1c0->x);
      lVar6 = (long)(local_1c0[1].y - local_1c0->y);
      if (lVar4 * lVar5 - lVar3 * lVar6 < 0) {
        local_238 = -(lVar4 * lVar5 - lVar3 * lVar6);
      }
      else {
        local_238 = lVar4 * lVar5 - lVar3 * lVar6;
      }
      if (local_230 * 0x2a < local_238) goto LAB_00513370;
      lVar7 = (long)(local_1c0[2].x - local_1c0->x);
      lVar8 = (long)(local_1c0[2].y - local_1c0->y);
      if (lVar4 * lVar7 - lVar3 * lVar8 < 0) {
        local_240 = -(lVar4 * lVar7 - lVar3 * lVar8);
      }
      else {
        local_240 = lVar4 * lVar7 - lVar3 * lVar8;
      }
      if (((local_230 * 0x2a < local_240) || (0 < lVar5 * (lVar5 - lVar3) + lVar6 * (lVar6 - lVar4))
          ) || (0 < lVar7 * (lVar7 - lVar3) + lVar8 * (lVar8 - lVar4))) goto LAB_00513370;
      gray_render_line(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                      );
      if (local_1c0 == &local_198) goto LAB_00513396;
      local_1c0 = local_1c0 + -3;
    } while( true );
  }
  *(long *)(in_RDI + 0x68) = (long)(*in_RCX << 2);
  *(long *)(in_RDI + 0x70) = (long)local_198.y;
LAB_00513396:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const QT_FT_Vector*  control1,
                              const QT_FT_Vector*  control2,
                              const QT_FT_Vector*  to )
  {
    QT_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    QT_FT_Vector*  arc = bez_stack;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = QT_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = QT_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = QT_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      gray_split_cubic( arc );
      arc += 3;
    }
  }